

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O2

llama_ubatch * __thiscall
llama_sbatch::split_simple(llama_ubatch *__return_storage_ptr__,llama_sbatch *this,size_t n_ubatch)

{
  llama_sbatch_seq *seq;
  llama_sbatch_seq *plVar1;
  
  if (this->n_tokens < n_ubatch) {
    n_ubatch = this->n_tokens;
  }
  reserve_ubatch(__return_storage_ptr__,this,n_ubatch,this->batch->embd != (float *)0x0);
  __return_storage_ptr__->equal_seqs = false;
  seq = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>._M_impl.
        super__Vector_impl_data._M_start;
  plVar1 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (seq != plVar1) {
    if (((long)plVar1 - (long)seq != 0x20) || (seq->n_seq_id != 0)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
                 ,0x93,"GGML_ASSERT(%s) failed","seq.size() == 1 && s.n_seq_id == 0");
    }
    if (seq->length < n_ubatch) {
      n_ubatch = seq->length;
    }
    add_seq_to_ubatch(this,__return_storage_ptr__,seq,n_ubatch);
  }
  return __return_storage_ptr__;
}

Assistant:

llama_ubatch llama_sbatch::split_simple(size_t n_ubatch) {
    n_ubatch = n_tokens < n_ubatch ? n_tokens : n_ubatch;
    llama_ubatch ubatch = reserve_ubatch(n_ubatch, /* has_embd */ batch->embd != nullptr);
    ubatch.equal_seqs = false;
    if (!seq.empty()) {
        llama_sbatch_seq & s = seq[0];
        size_t length = s.length < n_ubatch ? s.length : n_ubatch;
        GGML_ASSERT(seq.size() == 1 && s.n_seq_id == 0); // don't mix with other splits
        add_seq_to_ubatch(ubatch, s, length);
    }
    return ubatch;
}